

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void gen_any_value_header(Am_Value *old_val,Am_Value_List *part_chain,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Slot_Key slot_local;
  Am_Value_List *part_chain_local;
  Am_Value *old_val_local;
  
  if (slot == 0x175) {
    Am_Value_List::Add(part_chain,"Any_Command_",Am_TAIL,true);
  }
  else if (old_val->type == 0xa001) {
    Am_Value_List::Add(part_chain,"Any_Object_",Am_TAIL,true);
  }
  else {
    bVar1 = Am_Inter_Location::Test(old_val);
    if (bVar1) {
      Am_Value_List::Add(part_chain,"Any_Location_",Am_TAIL,true);
    }
    else {
      Am_Value_List::Add(part_chain,"Any_Value_",Am_TAIL,true);
    }
  }
  return;
}

Assistant:

void
gen_any_value_header(Am_Value &old_val, Am_Value_List &part_chain,
                     Am_Slot_Key slot)
{
  if (slot == Am_REGISTER_COMMAND) //then is the command part
    part_chain.Add("Any_Command_");
  else if (old_val.type == Am_OBJECT)
    part_chain.Add("Any_Object_");
  else if (Am_Inter_Location::Test(old_val))
    part_chain.Add("Any_Location_");
  else
    part_chain.Add("Any_Value_"); //hack
}